

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void swallowed(int first)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if (first == 0) {
    iVar3 = (int)swallowed::lasty;
    iVar7 = (int)swallowed::lastx;
    uVar8 = iVar3 - 1;
    do {
      iVar4 = 3;
      uVar6 = iVar7 - 2;
      do {
        bVar11 = uVar6 < 0x4f;
        uVar6 = uVar6 + 1;
        if (bVar11 && uVar8 < 0x15) {
          dbuf[uVar8][uVar6].effect = 0;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      bVar11 = uVar8 != iVar3 + 1U;
      uVar8 = uVar8 + 1;
    } while (bVar11);
    dbuf_set(level,iVar7,iVar3,(rm *)0x0,0,0,0,0,0,0,0,0,0,0);
  }
  else {
    memset(dbuf,0,0x9d80);
  }
  iVar3 = monsndx((u.ustuck)->data);
  if (iVar3 - 0x89U < 0x14) {
    iVar7 = 0x93;
    if (iVar3 - 0x89U < 10) {
      iVar7 = 0x89;
    }
    iVar3 = iVar7 + objects[(long)(iVar3 - iVar7) + 0x5f].oc_descr_idx + -0x5f;
  }
  iVar7 = (int)u.ux;
  if (iVar7 < 2) {
    if (u.ux < '\0') {
      display_self();
      bVar11 = false;
      bVar12 = false;
      goto LAB_0016bb4f;
    }
    bVar11 = false;
  }
  else {
    bVar11 = (byte)u.uy < 0x15 && (byte)u.ux < 0x51;
  }
  bVar12 = (byte)u.ux < 0x4f;
  bVar13 = (byte)u.uy < 0x15;
  bVar1 = bVar13 && bVar12;
  if (((byte)(iVar7 - 1U) < 0x4f) && ((byte)(u.uy - 1U) < 0x15)) {
    if (bVar11) {
      iVar5 = (int)u.uy;
      iVar4 = swallow_to_effect(iVar3,0);
      if (iVar5 - 1U < 0x15 && iVar7 - 2U < 0x4f) {
        dbuf[iVar5 - 1U][iVar7 - 1U & 0xff].effect = iVar4;
      }
    }
    uVar8 = (uint)u.ux;
    iVar4 = (int)u.uy;
    iVar7 = swallow_to_effect(iVar3,1);
    if (iVar4 - 1U < 0x15 && uVar8 - 1 < 0x4f) {
      dbuf[iVar4 - 1U][uVar8].effect = iVar7;
    }
    if (!bVar13 || !bVar12) {
      bVar1 = false;
      goto LAB_0016ba64;
    }
    uVar9 = (ulong)(byte)u.ux;
    iVar4 = (int)u.uy;
    iVar7 = swallow_to_effect(iVar3,2);
    bVar1 = true;
    if (0x14 < iVar4 - 1U || 0x4e < uVar9) goto LAB_0016ba64;
    *(int *)((ulong)(iVar4 - 1U) * 0x780 + 0x31e428 + uVar9 * 0x18) = iVar7;
    bVar1 = true;
    if (bVar11) goto LAB_0016ba69;
    display_self();
    bVar12 = false;
  }
  else {
LAB_0016ba64:
    if (bVar11) {
LAB_0016ba69:
      iVar4 = (int)u.ux;
      uVar9 = (ulong)(byte)u.uy;
      iVar7 = swallow_to_effect(iVar3,3);
      bVar12 = true;
      if (iVar4 - 2U < 0x4f && uVar9 < 0x15) {
        dbuf[uVar9][iVar4 - 1].effect = iVar7;
        display_self();
        bVar12 = true;
        if (!bVar1) {
          bVar11 = false;
          goto LAB_0016bb4f;
        }
        bVar12 = true;
        goto LAB_0016baed;
      }
    }
    else {
      bVar12 = false;
    }
    display_self();
    if (!bVar1) {
      bVar11 = false;
      goto LAB_0016bb4f;
    }
  }
LAB_0016baed:
  uVar9 = (ulong)(byte)u.ux;
  uVar10 = (ulong)(byte)u.uy;
  iVar7 = swallow_to_effect(iVar3,4);
  bVar11 = true;
  if (uVar10 < 0x15 && uVar9 < 0x4f) {
    *(int *)(uVar10 * 0x780 + 0x31e428 + uVar9 * 0x18) = iVar7;
  }
LAB_0016bb4f:
  bVar2 = u.ux - 1;
  if ((bVar2 < 0x4f) && (iVar7 = (int)u.uy, (byte)(u.uy + 1U) < 0x15)) {
    if (bVar12) {
      iVar4 = swallow_to_effect(iVar3,5);
      if (iVar7 + 1U < 0x15 && bVar2 - 1 < 0x4f) {
        dbuf[iVar7 + 1U][bVar2].effect = iVar4;
      }
    }
    uVar8 = (uint)u.ux;
    iVar4 = (int)u.uy;
    iVar7 = swallow_to_effect(iVar3,6);
    if (iVar4 + 1U < 0x15 && uVar8 - 1 < 0x4f) {
      dbuf[iVar4 + 1U][uVar8].effect = iVar7;
    }
    if (bVar11) {
      uVar9 = (ulong)(byte)u.ux;
      iVar7 = (int)u.uy;
      iVar3 = swallow_to_effect(iVar3,7);
      if (iVar7 + 1U < 0x15 && uVar9 < 0x4f) {
        *(int *)((ulong)(iVar7 + 1U) * 0x780 + 0x31e428 + uVar9 * 0x18) = iVar3;
      }
    }
  }
  swallowed::lastx = u.ux;
  swallowed::lasty = u.uy;
  return;
}

Assistant:

void swallowed(int first)
{
    static xchar lastx, lasty;	/* last swallowed position */
    int swallower, left_ok, rght_ok;

    if (first)
	cls();
    else {
	int x, y;
	/* Clear old location */
	for (y = lasty-1; y <= lasty+1; y++)
	    for (x = lastx-1; x <= lastx+1; x++)
		dbuf_set_effect(x,y,0);
	dbuf_set(level, lastx, lasty, NULL, 0,0,0,0,0,0,0,0,0,0); /* remove hero symbol */
    }

    /* Account for e.g. shuffled dragon appearances. */
    swallower = obfuscate_monster(monsndx(u.ustuck->data));
    /* assume isok(u.ux,u.uy) */
    left_ok = isok(u.ux-1,u.uy);
    rght_ok = isok(u.ux+1,u.uy);
    /*
     *  Display the hero surrounded by the monster's stomach.
     */
    if (isok(u.ux, u.uy-1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy-1, swallow_to_effect(swallower, S_sw_tl));
	dbuf_set_effect(u.ux, u.uy-1, swallow_to_effect(swallower, S_sw_tc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy-1, swallow_to_effect(swallower, S_sw_tr));
    }

    if (left_ok)
	dbuf_set_effect(u.ux-1, u.uy  , swallow_to_effect(swallower, S_sw_ml));
    display_self();
    if (rght_ok)
	dbuf_set_effect(u.ux+1, u.uy  , swallow_to_effect(swallower, S_sw_mr));

    if (isok(u.ux, u.uy+1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy+1, swallow_to_effect(swallower, S_sw_bl));
	dbuf_set_effect(u.ux, u.uy+1, swallow_to_effect(swallower, S_sw_bc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy+1, swallow_to_effect(swallower, S_sw_br));
    }

    /* Update the swallowed position. */
    lastx = u.ux;
    lasty = u.uy;
}